

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_G2(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if (((((env->spr_cb[0x137].name == (char *)0x0) && (env->spr[0x137] == 0)) &&
       (env->spr_cb[0x137].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      ((env->spr_cb[0x137].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x137].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
     (env->spr_cb[0x137].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
    env->spr_cb[0x137].name = "MBAR";
    env->spr_cb[0x137].uea_read = spr_noaccess;
    env->spr_cb[0x137].uea_write = spr_noaccess;
    env->spr_cb[0x137].oea_read = spr_read_generic;
    env->spr_cb[0x137].oea_write = spr_write_generic;
    env->spr_cb[0x137].hea_read = spr_read_generic;
    env->spr_cb[0x137].hea_write = spr_write_generic;
    env->spr_cb[0x137].default_value = 0;
    env->spr[0x137] = 0;
    if (((env->spr_cb[0x3a].name == (char *)0x0) && (env->spr[0x3a] == 0)) &&
       ((env->spr_cb[0x3a].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3a].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3a].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3a].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3a].name = "CSRR0";
      env->spr_cb[0x3a].uea_read = spr_noaccess;
      env->spr_cb[0x3a].uea_write = spr_noaccess;
      env->spr_cb[0x3a].oea_read = spr_read_generic;
      env->spr_cb[0x3a].oea_write = spr_write_generic;
      env->spr_cb[0x3a].hea_read = spr_read_generic;
      env->spr_cb[0x3a].hea_write = spr_write_generic;
      env->spr_cb[0x3a].default_value = 0;
      env->spr[0x3a] = 0;
      if (((env->spr_cb[0x3b].name == (char *)0x0) && (env->spr[0x3b] == 0)) &&
         (((env->spr_cb[0x3b].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3b].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3b].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x3b].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x3b].name = "CSRR1";
        env->spr_cb[0x3b].uea_read = spr_noaccess;
        env->spr_cb[0x3b].uea_write = spr_noaccess;
        env->spr_cb[0x3b].oea_read = spr_read_generic;
        env->spr_cb[0x3b].oea_write = spr_write_generic;
        env->spr_cb[0x3b].hea_read = spr_read_generic;
        env->spr_cb[0x3b].hea_write = spr_write_generic;
        env->spr_cb[0x3b].default_value = 0;
        env->spr[0x3b] = 0;
        if ((((env->spr_cb[0x3f5].name == (char *)0x0) && (env->spr[0x3f5] == 0)) &&
            (env->spr_cb[0x3f5].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
           (((env->spr_cb[0x3f5].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x3f5].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            (env->spr_cb[0x3f5].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
          env->spr_cb[0x3f5].name = "DABR";
          env->spr_cb[0x3f5].uea_read = spr_noaccess;
          env->spr_cb[0x3f5].uea_write = spr_noaccess;
          env->spr_cb[0x3f5].oea_read = spr_read_generic;
          env->spr_cb[0x3f5].oea_write = spr_write_generic;
          env->spr_cb[0x3f5].hea_read = spr_read_generic;
          env->spr_cb[0x3f5].hea_write = spr_write_generic;
          env->spr_cb[0x3f5].default_value = 0;
          env->spr[0x3f5] = 0;
          if (((env->spr_cb[0x13d].name == (char *)0x0) && (env->spr[0x13d] == 0)) &&
             ((env->spr_cb[0x13d].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x13d].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x13d].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x13d].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x13d].name = "DABR2";
            env->spr_cb[0x13d].uea_read = spr_noaccess;
            env->spr_cb[0x13d].uea_write = spr_noaccess;
            env->spr_cb[0x13d].oea_read = spr_read_generic;
            env->spr_cb[0x13d].oea_write = spr_write_generic;
            env->spr_cb[0x13d].hea_read = spr_read_generic;
            env->spr_cb[0x13d].hea_write = spr_write_generic;
            env->spr_cb[0x13d].default_value = 0;
            env->spr[0x13d] = 0;
            if ((((env->spr_cb[0x3f2].name == (char *)0x0) && (env->spr[0x3f2] == 0)) &&
                ((env->spr_cb[0x3f2].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x3f2].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x3f2].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))))))
               && (env->spr_cb[0x3f2].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
              env->spr_cb[0x3f2].name = "IABR";
              env->spr_cb[0x3f2].uea_read = spr_noaccess;
              env->spr_cb[0x3f2].uea_write = spr_noaccess;
              env->spr_cb[0x3f2].oea_read = spr_read_generic;
              env->spr_cb[0x3f2].oea_write = spr_write_generic;
              env->spr_cb[0x3f2].hea_read = spr_read_generic;
              env->spr_cb[0x3f2].hea_write = spr_write_generic;
              env->spr_cb[0x3f2].default_value = 0;
              env->spr[0x3f2] = 0;
              if (((((env->spr_cb[0x3fa].name == (char *)0x0) && (env->spr[0x3fa] == 0)) &&
                   (env->spr_cb[0x3fa].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  ((env->spr_cb[0x3fa].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x3fa].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                 (env->spr_cb[0x3fa].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
                env->spr_cb[0x3fa].name = "IABR2";
                env->spr_cb[0x3fa].uea_read = spr_noaccess;
                env->spr_cb[0x3fa].uea_write = spr_noaccess;
                env->spr_cb[0x3fa].oea_read = spr_read_generic;
                env->spr_cb[0x3fa].oea_write = spr_write_generic;
                env->spr_cb[0x3fa].hea_read = spr_read_generic;
                env->spr_cb[0x3fa].hea_write = spr_write_generic;
                env->spr_cb[0x3fa].default_value = 0;
                env->spr[0x3fa] = 0;
                if (((env->spr_cb[0x135].name == (char *)0x0) && (env->spr[0x135] == 0)) &&
                   ((env->spr_cb[0x135].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                    (((env->spr_cb[0x135].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                      (env->spr_cb[0x135].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                     && (env->spr_cb[0x135].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)
                     ))))) {
                  env->spr_cb[0x135].name = "IBCR";
                  env->spr_cb[0x135].uea_read = spr_noaccess;
                  env->spr_cb[0x135].uea_write = spr_noaccess;
                  env->spr_cb[0x135].oea_read = spr_read_generic;
                  env->spr_cb[0x135].oea_write = spr_write_generic;
                  env->spr_cb[0x135].hea_read = spr_read_generic;
                  env->spr_cb[0x135].hea_write = spr_write_generic;
                  env->spr_cb[0x135].default_value = 0;
                  env->spr[0x135] = 0;
                  if (((env->spr_cb[0x136].name == (char *)0x0) && (env->spr[0x136] == 0)) &&
                     (((env->spr_cb[0x136].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                       ((env->spr_cb[0x136].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0
                        && (env->spr_cb[0x136].uea_read ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                      (env->spr_cb[0x136].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))
                     ) {
                    env->spr_cb[0x136].name = "DBCR";
                    env->spr_cb[0x136].uea_read = spr_noaccess;
                    env->spr_cb[0x136].uea_write = spr_noaccess;
                    env->spr_cb[0x136].oea_read = spr_read_generic;
                    env->spr_cb[0x136].oea_write = spr_write_generic;
                    env->spr_cb[0x136].hea_read = spr_read_generic;
                    env->spr_cb[0x136].hea_write = spr_write_generic;
                    env->spr_cb[0x136].default_value = 0;
                    env->spr[0x136] = 0;
                    return;
                  }
                  uVar2 = 0x136;
                  uVar1 = 0x136;
                }
                else {
                  uVar2 = 0x135;
                  uVar1 = 0x135;
                }
              }
              else {
                uVar2 = 0x3fa;
                uVar1 = 0x3fa;
              }
            }
            else {
              uVar2 = 0x3f2;
              uVar1 = 0x3f2;
            }
          }
          else {
            uVar2 = 0x13d;
            uVar1 = 0x13d;
          }
        }
        else {
          uVar2 = 0x3f5;
          uVar1 = 0x3f5;
        }
      }
      else {
        uVar2 = 0x3b;
        uVar1 = 0x3b;
      }
    }
    else {
      uVar2 = 0x3a;
      uVar1 = 0x3a;
    }
  }
  else {
    uVar2 = 0x137;
    uVar1 = 0x137;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_G2(CPUPPCState *env)
{
    /* Memory base address */
    /* MBAR */
    /* XXX : not implemented */
    spr_register(env, SPR_MBAR, "MBAR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Exception processing */
    spr_register(env, SPR_BOOKE_CSRR0, "CSRR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_BOOKE_CSRR1, "CSRR1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Breakpoints */
    /* XXX : not implemented */
    spr_register(env, SPR_DABR, "DABR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_DABR2, "DABR2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_IABR, "IABR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_IABR2, "IABR2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_IBCR, "IBCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_DBCR, "DBCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
}